

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOWFileParser.cpp
# Opt level: O0

void __thiscall BOWFileParser::BOWFileParser(BOWFileParser *this,string *filename)

{
  string *filename_local;
  BOWFileParser *this_local;
  
  std::ifstream::ifstream(this,(string *)filename,_S_in);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->_wordList);
  this->_V = 0;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&this->_frequencyMatrix);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&this->_docVoca);
  readBOWFile(this);
  makeDocVoca(this);
  return;
}

Assistant:

BOWFileParser::BOWFileParser(string filename):_inputText(filename),_V(0){//{{{
    this->readBOWFile();
    this->makeDocVoca();
}